

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.c
# Opt level: O2

void assert_true(TestReporter *reporter,char *file,int line,int result,char *message,...)

{
  char in_AL;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arguments;
  __va_list_tag local_e8;
  undefined1 local_c8 [40];
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.gp_offset = 0x28;
  local_e8.fp_offset = 0x30;
  local_e8.overflow_arg_area = &arguments[0].overflow_arg_area;
  local_a0 = in_R9;
  (*(&reporter->show_pass)[(ulong)(result == 0) * 2])(reporter,file,line,message,&local_e8);
  add_reporter_result(reporter,result);
  return;
}

Assistant:

static void assert_true(TestReporter *reporter, const char *file, int line,
                        int result, const char *message, ...) {
    va_list arguments;
    memset(&arguments, 0, sizeof(va_list));

    va_start(arguments, message);
    if (result) {
            (*reporter->show_pass)(reporter, file, line, message, arguments);
    } else {
            (*reporter->show_fail)(reporter, file, line, message, arguments);
    }

    add_reporter_result(reporter, result);
    va_end(arguments);
}